

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O0

aiExportFormatDesc * aiGetExportFormatDescription(size_t index)

{
  char *pcVar1;
  char *pcVar2;
  aiExportFormatDesc *paVar3;
  size_t sVar4;
  void *pvVar5;
  aiExportFormatDesc *desc;
  aiExportFormatDesc *orig;
  Exporter exporter;
  size_t index_local;
  
  exporter.pimpl = (ExporterPimpl *)index;
  Assimp::Exporter::Exporter((Exporter *)&orig);
  paVar3 = Assimp::Exporter::GetExportFormatDescription((Exporter *)&orig,(size_t)exporter.pimpl);
  if (paVar3 == (aiExportFormatDesc *)0x0) {
    index_local = 0;
  }
  else {
    index_local = (size_t)operator_new(0x18);
    sVar4 = strlen(paVar3->description);
    pvVar5 = operator_new__(sVar4 + 1);
    memset(pvVar5,0,sVar4 + 1);
    *(void **)(index_local + 8) = pvVar5;
    pcVar1 = *(char **)(index_local + 8);
    pcVar2 = paVar3->description;
    sVar4 = strlen(pcVar2);
    strncpy(pcVar1,pcVar2,sVar4);
    sVar4 = strlen(paVar3->fileExtension);
    pvVar5 = operator_new__(sVar4 + 1);
    memset(pvVar5,0,sVar4 + 1);
    *(void **)(index_local + 0x10) = pvVar5;
    pcVar1 = *(char **)(index_local + 0x10);
    pcVar2 = paVar3->fileExtension;
    sVar4 = strlen(pcVar2);
    strncpy(pcVar1,pcVar2,sVar4);
    sVar4 = strlen(paVar3->id);
    pvVar5 = operator_new__(sVar4 + 1);
    memset(pvVar5,0,sVar4 + 1);
    *(void **)index_local = pvVar5;
    pcVar1 = *(char **)index_local;
    pcVar2 = paVar3->id;
    sVar4 = strlen(paVar3->id);
    strncpy(pcVar1,pcVar2,sVar4);
  }
  Assimp::Exporter::~Exporter((Exporter *)&orig);
  return (aiExportFormatDesc *)index_local;
}

Assistant:

ASSIMP_API const aiExportFormatDesc* aiGetExportFormatDescription( size_t index)
{
    // Note: this is valid as the index always pertains to a built-in exporter,
    // for which the returned structure is guaranteed to be of static storage duration.
    Exporter exporter;
    const aiExportFormatDesc* orig( exporter.GetExportFormatDescription( index ) );
    if (NULL == orig) {
        return NULL;
    }

    aiExportFormatDesc *desc = new aiExportFormatDesc;
    desc->description = new char[ strlen( orig->description ) + 1 ]();
    ::strncpy( (char*) desc->description, orig->description, strlen( orig->description ) );
    desc->fileExtension = new char[ strlen( orig->fileExtension ) + 1 ]();
    ::strncpy( ( char* ) desc->fileExtension, orig->fileExtension, strlen( orig->fileExtension ) );
    desc->id = new char[ strlen( orig->id ) + 1 ]();
    ::strncpy( ( char* ) desc->id, orig->id, strlen( orig->id ) );

    return desc;
}